

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

TransliteratorEntry * __thiscall
icu_63::TransliteratorRegistry::findInStaticStore
          (TransliteratorRegistry *this,TransliteratorSpec *src,TransliteratorSpec *trg,
          UnicodeString *variant)

{
  UBool UVar1;
  UnicodeString *source;
  UnicodeString *target;
  undefined8 local_30;
  TransliteratorEntry *entry;
  UnicodeString *variant_local;
  TransliteratorSpec *trg_local;
  TransliteratorSpec *src_local;
  TransliteratorRegistry *this_local;
  
  local_30 = (TransliteratorEntry *)0x0;
  UVar1 = TransliteratorSpec::isLocale(src);
  if (UVar1 == '\0') {
    UVar1 = TransliteratorSpec::isLocale(trg);
    if (UVar1 != '\0') {
      local_30 = findInBundle(trg,src,variant,UTRANS_REVERSE);
    }
  }
  else {
    local_30 = findInBundle(src,trg,variant,UTRANS_FORWARD);
  }
  if (local_30 != (TransliteratorEntry *)0x0) {
    source = TransliteratorSpec::getTop(src);
    target = TransliteratorSpec::getTop(trg);
    registerEntry(this,source,target,variant,local_30,'\0');
  }
  return local_30;
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInStaticStore(const TransliteratorSpec& src,
                                                 const TransliteratorSpec& trg,
                                                 const UnicodeString& variant) {
    TransliteratorEntry* entry = 0;
    if (src.isLocale()) {
        entry = findInBundle(src, trg, variant, UTRANS_FORWARD);
    } else if (trg.isLocale()) {
        entry = findInBundle(trg, src, variant, UTRANS_REVERSE);
    }

    // If we found an entry, store it in the Hashtable for next
    // time.
    if (entry != 0) {
        registerEntry(src.getTop(), trg.getTop(), variant, entry, FALSE);
    }

    return entry;
}